

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readDeepScanLineFile.cpp
# Opt level: O1

void readDeepScanLineFile
               (char *filename,Box2i *displayWindow,Box2i *dataWindow,Array2D<float_*> *dataZ,
               Array2D<Imath_3_2::half_*> *dataA,Array2D<unsigned_int> *sampleCount)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec2<int> *pVVar4;
  uint *puVar5;
  float **ppfVar6;
  half **pphVar7;
  void *pvVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long local_148;
  long local_120;
  DeepScanLineInputFile file;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  _Base_ptr local_d8;
  Slice local_d0 [56];
  DeepFrameBuffer frameBuffer;
  
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::DeepScanLineInputFile::DeepScanLineInputFile(&file,filename,iVar1);
  Imf_3_4::DeepScanLineInputFile::header();
  pVVar4 = (Vec2<int> *)Imf_3_4::Header::dataWindow();
  dataWindow->min = *pVVar4;
  dataWindow->max = pVVar4[1];
  pVVar4 = (Vec2<int> *)Imf_3_4::Header::displayWindow();
  displayWindow->min = *pVVar4;
  displayWindow->max = pVVar4[1];
  iVar1 = (dataWindow->max).x - (dataWindow->min).x;
  iVar2 = (dataWindow->max).y - (dataWindow->min).y;
  uVar3 = iVar2 + 1;
  lVar9 = (long)(int)uVar3;
  lVar11 = (long)(int)((long)iVar1 + 1);
  uVar14 = lVar9 * lVar11;
  puVar5 = (uint *)operator_new__(-(ulong)(uVar14 >> 0x3e != 0) | uVar14 * 4);
  if (sampleCount->_data != (uint *)0x0) {
    operator_delete__(sampleCount->_data);
  }
  sampleCount->_sizeX = lVar9;
  sampleCount->_sizeY = lVar11;
  sampleCount->_data = puVar5;
  uVar14 = -(ulong)(uVar14 >> 0x3d != 0) | uVar14 * 8;
  ppfVar6 = (float **)operator_new__(uVar14);
  if (dataZ->_data != (float **)0x0) {
    operator_delete__(dataZ->_data);
  }
  dataZ->_sizeX = lVar9;
  dataZ->_sizeY = lVar11;
  dataZ->_data = ppfVar6;
  pphVar7 = (half **)operator_new__(uVar14);
  if (dataA->_data != (half **)0x0) {
    operator_delete__(dataA->_data);
  }
  dataA->_sizeX = lVar9;
  dataA->_sizeY = lVar11;
  dataA->_data = pphVar7;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_4::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
  Imf_3_4::Slice::Slice
            (local_d0,UINT,
             (char *)(sampleCount->_data +
                     (-(long)(dataWindow->min).x - (long)(dataWindow->min).y * ((long)iVar1 + 1))),4
             ,lVar11 * 4,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  Imf_3_4::DeepSlice::DeepSlice
            ((DeepSlice *)local_d0,FLOAT,
             (char *)(dataZ->_data + (-(long)(dataWindow->min).x - (dataWindow->min).y * lVar11)),8,
             lVar11 * 8,4,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insert((char *)&frameBuffer,(DeepSlice *)"dataZ");
  Imf_3_4::DeepSlice::DeepSlice
            ((DeepSlice *)local_d0,HALF,
             (char *)(dataA->_data + (-(long)(dataWindow->min).x - (dataWindow->min).y * lVar11)),8,
             lVar11 * 8,2,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insert((char *)&frameBuffer,(DeepSlice *)"dataA");
  Imf_3_4::DeepScanLineInputFile::setFrameBuffer((DeepFrameBuffer *)&file);
  Imf_3_4::DeepScanLineInputFile::readPixelSampleCounts((int)&file,(dataWindow->min).y);
  if (-1 < iVar2) {
    lVar9 = sampleCount->_sizeY;
    local_148 = 0;
    local_120 = 0;
    uVar14 = 0;
    do {
      if (-1 < iVar1) {
        lVar12 = dataA->_sizeY * local_120;
        lVar13 = dataZ->_sizeY * local_120;
        uVar10 = (ulong)(iVar1 + 1);
        lVar11 = local_148;
        do {
          pvVar8 = operator_new__((ulong)*(uint *)((long)sampleCount->_data + lVar11) << 2);
          *(void **)((long)dataZ->_data + lVar13) = pvVar8;
          pvVar8 = operator_new__((ulong)*(uint *)((long)sampleCount->_data + lVar11) * 2);
          *(void **)((long)dataA->_data + lVar12) = pvVar8;
          lVar12 = lVar12 + 8;
          lVar11 = lVar11 + 4;
          lVar13 = lVar13 + 8;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
      }
      uVar14 = uVar14 + 1;
      local_120 = local_120 + 8;
      local_148 = local_148 + lVar9 * 4;
    } while (uVar14 != uVar3);
  }
  Imf_3_4::DeepScanLineInputFile::readPixels((int)&file,(dataWindow->min).y);
  if (-1 < iVar2) {
    lVar9 = 0;
    uVar14 = 0;
    do {
      if (-1 < iVar1) {
        uVar10 = 0;
        do {
          pvVar8 = *(void **)((long)dataZ->_data + uVar10 * 8 + dataZ->_sizeY * lVar9);
          if (pvVar8 != (void *)0x0) {
            operator_delete__(pvVar8);
          }
          pvVar8 = *(void **)((long)dataA->_data + uVar10 * 8 + dataA->_sizeY * lVar9);
          if (pvVar8 != (void *)0x0) {
            operator_delete__(pvVar8);
          }
          uVar10 = uVar10 + 1;
        } while (iVar1 + 1 != uVar10);
      }
      uVar14 = uVar14 + 1;
      lVar9 = lVar9 + 8;
    } while (uVar14 != uVar3);
  }
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
               *)&frameBuffer);
  if (local_d8 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8);
  }
  if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
  }
  return;
}

Assistant:

void
readDeepScanLineFile (
    const char             filename[],
    Box2i&                 displayWindow,
    Box2i&                 dataWindow,
    Array2D<float*>&       dataZ,
    Array2D<half*>&        dataA,
    Array2D<unsigned int>& sampleCount)
{
    DeepScanLineInputFile file (filename);

    const Header& header = file.header ();
    dataWindow           = header.dataWindow ();
    displayWindow        = header.displayWindow ();

    int width  = dataWindow.max.x - dataWindow.min.x + 1;
    int height = dataWindow.max.y - dataWindow.min.y + 1;

    sampleCount.resizeErase (height, width);

    dataZ.resizeErase (height, width);
    dataA.resizeErase (height, width);

    DeepFrameBuffer frameBuffer;

    frameBuffer.insertSampleCountSlice (Slice (
        UINT,
        (char*) (&sampleCount[0][0] - dataWindow.min.x - dataWindow.min.y * width),
        sizeof (unsigned int) * 1,       // xStride
        sizeof (unsigned int) * width)); // yStride

    frameBuffer.insert (
        "dataZ",
        DeepSlice (
            FLOAT,
            (char*) (&dataZ[0][0] - dataWindow.min.x - dataWindow.min.y * width),

            sizeof (float*) * 1,     // xStride for pointer array
            sizeof (float*) * width, // yStride for pointer array
            sizeof (float) * 1));    // stride for Z data sample

    frameBuffer.insert (
        "dataA",
        DeepSlice (
            HALF,
            (char*) (&dataA[0][0] - dataWindow.min.x - dataWindow.min.y * width),
            sizeof (half*) * 1,     // xStride for pointer array
            sizeof (half*) * width, // yStride for pointer array
            sizeof (half) * 1));    // stride for O data sample

    file.setFrameBuffer (frameBuffer);

    file.readPixelSampleCounts (dataWindow.min.y, dataWindow.max.y);

    for (int i = 0; i < height; i++)
    {
        for (int j = 0; j < width; j++)
        {

            dataZ[i][j] = new float[sampleCount[i][j]];
            dataA[i][j] = new half[sampleCount[i][j]];
        }
    }

    file.readPixels (dataWindow.min.y, dataWindow.max.y);

    for (int i = 0; i < height; i++)
    {
        for (int j = 0; j < width; j++)
        {
            delete[] dataZ[i][j];
            delete[] dataA[i][j];
        }
    }
}